

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O2

void hexToRev(void *dest,char *src)

{
  size_t sVar1;
  
  for (sVar1 = strLen(src); sVar1 != 0; sVar1 = sVar1 - 2) {
    *(octet *)dest = hex_dec_table[(byte)src[sVar1 - 2]] << 4 | hex_dec_table[(byte)src[sVar1 - 1]];
    dest = (void *)((long)dest + 1);
  }
  return;
}

Assistant:

void hexToRev(void* dest, const char* src)
{
	size_t count;
	ASSERT(hexIsValid(src));
	ASSERT(memIsDisjoint2(src, strLen(src) + 1, dest, strLen(src) / 2));
	count = strLen(src);
	src = src + count;
	for (; count; count -= 2, dest = (octet*)dest + 1)
		*(octet*)dest = hexToO(src -= 2);
}